

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

void equation_system_add(aom_equation_system_t *dest,aom_equation_system_t *src)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  
  lVar3 = (long)dest->n;
  if (0 < lVar3) {
    pdVar4 = src->A;
    pdVar1 = src->b;
    pdVar5 = dest->A;
    pdVar2 = dest->b;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        pdVar5[lVar7] = pdVar4[lVar7] + pdVar5[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar3 != lVar7);
      pdVar2[lVar6] = pdVar1[lVar6] + pdVar2[lVar6];
      lVar6 = lVar6 + 1;
      pdVar5 = pdVar5 + lVar3;
      pdVar4 = pdVar4 + lVar3;
    } while (lVar6 != lVar3);
  }
  return;
}

Assistant:

static void equation_system_add(aom_equation_system_t *dest,
                                aom_equation_system_t *src) {
  const int n = dest->n;
  int i, j;
  for (i = 0; i < n; ++i) {
    for (j = 0; j < n; ++j) {
      dest->A[i * n + j] += src->A[i * n + j];
    }
    dest->b[i] += src->b[i];
  }
}